

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O0

bool loadBuffers(void)

{
  bool bVar1;
  undefined1 local_9;
  bool v;
  
  local_9 = loadTransformBuffer();
  if (local_9) {
    bVar1 = loadPatchBuffer();
    local_9 = local_9 && bVar1;
  }
  if (local_9 != false) {
    bVar1 = loadSubdivisionBuffers();
    local_9 = (local_9 & bVar1) != 0;
  }
  if (local_9 != false) {
    bVar1 = loadSubdCounterBuffer((int *)0x0);
    local_9 = (local_9 & bVar1) != 0;
  }
  return local_9;
}

Assistant:

bool loadBuffers()
{
    bool v = true;

    if (v) v&= loadTransformBuffer();
    if (v) v&= loadPatchBuffer();
    if (v) v&= loadSubdivisionBuffers();
    if (v) v&= loadSubdCounterBuffer();

    return v;
}